

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O1

termchar * term_bidi_line(Terminal *term,termline *ldata,wchar_t scr_y)

{
  short *psVar1;
  truecolour *ptVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  bidi_cache_entry *pbVar6;
  wchar_t *pwVar7;
  unsigned_long uVar8;
  unsigned_long uVar9;
  unsigned_long uVar10;
  _Bool _Var11;
  int iVar12;
  bidi_char *pbVar13;
  termchar *ptVar14;
  size_t factor1;
  bidi_cache_entry *pbVar15;
  termchar *ptVar16;
  wchar_t *pwVar17;
  wchar_t wVar18;
  ulong oldlen;
  wchar_t wVar19;
  unsigned_short *puVar20;
  ulong uVar21;
  ulong uVar22;
  termchar **pptVar23;
  long lVar24;
  undefined4 uVar25;
  uint uVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  unsigned_long *puVar30;
  wchar_t wVar31;
  termchar *ptVar32;
  ulong uVar33;
  
  if (((term->no_bidi == true) && (term->no_arabicshaping == true)) &&
     ((ldata->trusted != true || (term->cols < L'\x04')))) {
    return (termchar *)0x0;
  }
  wVar31 = term->cols;
  uVar22 = (ulong)(uint)wVar31;
  pbVar15 = term->pre_bidi_cache;
  oldlen = (ulong)scr_y;
  if ((((pbVar15 == (bidi_cache_entry *)0x0) || (term->bidi_cache_size <= oldlen)) ||
      (pbVar15[oldlen].chars == (termchar *)0x0)) ||
     ((pbVar15[oldlen].width != wVar31 || (pbVar15[oldlen].trusted != ldata->trusted)))) {
LAB_0010bc1a:
    if (term->wcFromTo_size < wVar31) {
      term->wcFromTo_size = wVar31;
      pbVar13 = (bidi_char *)saferealloc(term->wcFrom,(long)wVar31,0xc);
      term->wcFrom = pbVar13;
      pbVar13 = (bidi_char *)saferealloc(term->wcTo,(long)term->wcFromTo_size,0xc);
      term->wcTo = pbVar13;
    }
    wVar31 = term->cols;
    if (0 < (long)wVar31) {
      ptVar14 = ldata->chars;
      puVar20 = &term->wcFrom->nchars;
      lVar24 = 0;
      do {
        uVar22 = ptVar14->chr;
        uVar26 = (uint)uVar22 & 0xffffff00;
        if (uVar26 == 0xd800) {
LAB_0010bcbc:
          lVar27 = 0x40c;
LAB_0010bcca:
          uVar22 = (ulong)*(uint *)((long)term->ucsdata->unitab_scoacs +
                                   (uVar22 & 0xff) * 4 + lVar27 + -0xc);
        }
        else {
          if (uVar26 == 0xda00) {
            lVar27 = 0xc;
            goto LAB_0010bcca;
          }
          if (uVar26 == 0xd900) {
            lVar27 = 0xc0c;
            if (term->rawcnp == true) goto LAB_0010bcbc;
            goto LAB_0010bcca;
          }
        }
        uVar26 = (uint)uVar22;
        if ((uVar26 & 0xffffff00) == 0xdd00) {
          lVar27 = 0x80c;
LAB_0010bd03:
          uVar26 = *(uint *)((long)term->ucsdata->unitab_scoacs +
                            (uVar22 & 0xff) * 4 + lVar27 + -0xc);
        }
        else if ((uVar26 & 0xffffff00) == 0xdc00) {
          lVar27 = 0x100c;
          goto LAB_0010bd03;
        }
        *(uint *)(puVar20 + -3) = uVar26;
        ((bidi_char *)(puVar20 + -5))->origwc = uVar26;
        puVar20[-1] = (unsigned_short)lVar24;
        *puVar20 = 1;
        lVar24 = lVar24 + 1;
        puVar20 = puVar20 + 6;
        ptVar14 = ptVar14 + 1;
      } while (wVar31 != lVar24);
    }
    if ((L'\x03' < wVar31) && (ldata->trusted != false)) {
      memmove(term->wcFrom + 3,term->wcFrom,(ulong)(uint)(wVar31 + L'\xfffffffd') * 0xc);
      pbVar13 = term->wcFrom;
      lVar24 = 0;
      do {
        uVar25 = 0x20;
        if (lVar24 == 0xc) {
          uVar25 = 0xdfff;
        }
        if (lVar24 == 0) {
          uVar25 = 0xdffe;
        }
        *(undefined4 *)((long)&pbVar13->wc + lVar24) = uVar25;
        *(undefined4 *)((long)&pbVar13->origwc + lVar24) = uVar25;
        *(undefined4 *)((long)&pbVar13->index + lVar24) = 0x1ffff;
        lVar24 = lVar24 + 0xc;
      } while (lVar24 != 0x24);
    }
    if (term->cols < L'\x01') {
      wVar31 = L'\0';
    }
    else {
      wVar31 = L'\0';
      lVar24 = 0;
      wVar18 = L'\0';
      do {
        pbVar13 = term->wcFrom;
        *(undefined4 *)((long)&pbVar13->index + lVar24) = *(undefined4 *)&pbVar13[wVar18].index;
        *(undefined8 *)((long)&pbVar13->origwc + lVar24) = *(undefined8 *)(pbVar13 + wVar18);
        wVar19 = wVar18 + L'\x01';
        if ((wVar19 < term->cols) && (term->wcFrom[wVar19].wc == 0xdfff)) {
          psVar1 = (short *)((long)&term->wcFrom->nchars + lVar24);
          *psVar1 = *psVar1 + 1;
          wVar18 = wVar19;
        }
        wVar18 = wVar18 + L'\x01';
        lVar24 = lVar24 + 0xc;
        wVar31 = wVar31 + L'\x01';
      } while (wVar18 < term->cols);
    }
    uVar22 = (ulong)(uint)wVar31;
    if (term->no_bidi == false) {
      do_bidi(term->bidi_ctx,term->wcFrom,uVar22);
    }
    if (term->no_arabicshaping == false) {
      do_shape(term->wcFrom,term->wcTo,wVar31);
    }
    else {
      memcpy(term->wcTo,term->wcFrom,uVar22 * 0xc);
    }
    wVar18 = ldata->size;
    if (term->ltemp_size < wVar18) {
      term->ltemp_size = wVar18;
      ptVar14 = (termchar *)saferealloc(term->ltemp,(long)wVar18,0x20);
      term->ltemp = ptVar14;
    }
    pptVar23 = &term->ltemp;
    memcpy(term->ltemp,ldata->chars,(long)ldata->size << 5);
    if (wVar31 == L'\0') {
      wVar31 = L'\0';
    }
    else {
      uVar21 = 0;
      wVar31 = L'\0';
      do {
        if (term->wcTo[uVar21].nchars != 0) {
          uVar3 = term->wcTo[uVar21].index;
          lVar24 = (long)wVar31 << 5;
          iVar12 = -wVar31;
          uVar26 = 0;
          do {
            puVar30 = (unsigned_long *)((long)&(*pptVar23)->chr + lVar24);
            if (uVar3 == 0xffff) {
              uVar8 = (term->basic_erase_char).chr;
              uVar9 = (term->basic_erase_char).attr;
              uVar10 = *(unsigned_long *)&(term->basic_erase_char).cc_next;
              *(truecolour *)(puVar30 + 2) = (term->basic_erase_char).truecolour;
              puVar30[3] = uVar10;
              *puVar30 = uVar8;
              puVar30[1] = uVar9;
              uVar33 = 0xdfff;
              if (uVar26 == 0) {
                uVar33 = (ulong)term->wcTo[uVar21].origwc;
              }
              ptVar14 = *pptVar23;
LAB_0010bf86:
              *(ulong *)((long)&ptVar14->chr + lVar24) = uVar33;
            }
            else {
              ptVar14 = ldata->chars + uVar3;
              uVar8 = ptVar14->chr;
              uVar9 = ptVar14->attr;
              ptVar2 = &ldata->chars[uVar3].truecolour;
              uVar10 = *(unsigned_long *)(ptVar2 + 1);
              *(truecolour *)(puVar30 + 2) = *ptVar2;
              puVar30[3] = uVar10;
              *puVar30 = uVar8;
              puVar30[1] = uVar9;
              ptVar14 = *pptVar23;
              iVar4 = *(int *)((long)&ptVar14->cc_next + lVar24);
              if (iVar4 != 0) {
                *(uint *)((long)&ptVar14->cc_next + lVar24) = iVar4 + (uint)uVar3 + iVar12;
              }
              uVar33 = 0xdfff;
              if ((uVar26 != 0) ||
                 (uVar5 = term->wcTo[uVar21].wc, uVar33 = (ulong)uVar5,
                 term->wcTo[uVar21].origwc != uVar5)) goto LAB_0010bf86;
            }
            uVar26 = uVar26 + 1;
            lVar24 = lVar24 + 0x20;
            iVar12 = iVar12 + -1;
          } while (uVar26 < term->wcTo[uVar21].nchars);
          wVar31 = -iVar12;
        }
        uVar21 = uVar21 + 1;
      } while (uVar21 != uVar22);
    }
    wVar18 = term->cols;
    if (wVar31 != wVar18) {
      __assert_fail("opos == term->cols",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                    ,0x16e9,"termchar *term_bidi_line(Terminal *, struct termline *, int)");
    }
    uVar22 = (ulong)wVar18;
    ptVar14 = ldata->chars;
    ptVar32 = term->ltemp;
    pbVar13 = term->wcTo;
    factor1 = (size_t)ldata->size;
    _Var11 = ldata->trusted;
    if ((term->pre_bidi_cache == (bidi_cache_entry *)0x0) || (term->bidi_cache_size <= oldlen)) {
      uVar21 = term->bidi_cache_size;
      pbVar15 = (bidi_cache_entry *)
                safegrowarray(term->pre_bidi_cache,&term->bidi_cache_size,0x20,oldlen,1,false);
      term->pre_bidi_cache = pbVar15;
      pbVar15 = (bidi_cache_entry *)saferealloc(term->post_bidi_cache,term->bidi_cache_size,0x20);
      term->post_bidi_cache = pbVar15;
      lVar24 = term->bidi_cache_size - uVar21;
      if (uVar21 <= term->bidi_cache_size && lVar24 != 0) {
        pbVar6 = term->pre_bidi_cache;
        lVar27 = uVar21 << 5;
        do {
          *(undefined8 *)((long)&pbVar15->chars + lVar27) = 0;
          *(undefined8 *)((long)&pbVar6->chars + lVar27) = 0;
          *(undefined4 *)((long)&pbVar15->width + lVar27) = 0xffffffff;
          *(undefined4 *)((long)&pbVar6->width + lVar27) = 0xffffffff;
          (&pbVar6->trusted)[lVar27] = false;
          (&pbVar15->trusted)[lVar27] = false;
          *(undefined8 *)((long)&pbVar15->forward + lVar27) = 0;
          *(undefined8 *)((long)&pbVar6->forward + lVar27) = 0;
          *(undefined8 *)((long)&pbVar15->backward + lVar27) = 0;
          *(undefined8 *)((long)&pbVar6->backward + lVar27) = 0;
          lVar27 = lVar27 + 0x20;
          lVar24 = lVar24 + -1;
        } while (lVar24 != 0);
      }
    }
    safefree(term->pre_bidi_cache[oldlen].chars);
    safefree(term->post_bidi_cache[oldlen].chars);
    safefree(term->post_bidi_cache[oldlen].forward);
    safefree(term->post_bidi_cache[oldlen].backward);
    pbVar15 = term->pre_bidi_cache;
    pbVar15[oldlen].width = wVar18;
    pbVar15[oldlen].trusted = _Var11;
    ptVar16 = (termchar *)safemalloc(factor1,0x20,0);
    term->pre_bidi_cache[oldlen].chars = ptVar16;
    pbVar15 = term->post_bidi_cache;
    pbVar15[oldlen].width = wVar18;
    pbVar15[oldlen].trusted = _Var11;
    ptVar16 = (termchar *)safemalloc(factor1,0x20,0);
    term->post_bidi_cache[oldlen].chars = ptVar16;
    pwVar17 = (wchar_t *)safemalloc(uVar22,4,0);
    term->post_bidi_cache[oldlen].forward = pwVar17;
    pwVar17 = (wchar_t *)safemalloc(uVar22,4,0);
    term->post_bidi_cache[oldlen].backward = pwVar17;
    memcpy(term->pre_bidi_cache[oldlen].chars,ptVar14,factor1 << 5);
    memcpy(term->post_bidi_cache[oldlen].chars,ptVar32,factor1 << 5);
    memset(term->post_bidi_cache[oldlen].forward,0,uVar22 * 4);
    memset(term->post_bidi_cache[oldlen].backward,0,uVar22 * 4);
    if (wVar18 != L'\0') {
      lVar24 = 0;
      uVar21 = 0;
      do {
        uVar3 = pbVar13[lVar24].index;
        if (uVar3 != 0xffff) {
          if (wVar18 <= (int)(uint)uVar3) {
            __assert_fail("0 <= p && p < width",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                          ,0x1663,
                          "void term_bidi_cache_store(Terminal *, int, termchar *, termchar *, bidi_char *, int, int, _Bool)"
                         );
          }
          uVar33 = (ulong)pbVar13[lVar24].nchars;
          if (uVar33 != 0) {
            pwVar17 = term->post_bidi_cache[oldlen].forward;
            pwVar7 = term->post_bidi_cache[oldlen].backward;
            uVar28 = (ulong)(uint)uVar3;
            uVar29 = uVar21;
            do {
              pwVar7[uVar29] = (wchar_t)uVar28;
              pwVar17[uVar28] = (wchar_t)uVar29;
              uVar29 = uVar29 + 1;
              uVar28 = uVar28 + 1;
              uVar33 = uVar33 - 1;
            } while (uVar33 != 0);
          }
        }
        uVar21 = uVar21 + pbVar13[lVar24].nchars;
        lVar24 = lVar24 + 1;
      } while (uVar21 < uVar22);
    }
  }
  else {
    if (L'\0' < wVar31) {
      ptVar14 = ldata->chars;
      ptVar32 = pbVar15[oldlen].chars;
      do {
        uVar22 = uVar22 - 1;
        _Var11 = termchars_equal_override(ptVar32,ptVar14,ptVar14->chr,ptVar14->attr);
        if (!_Var11) break;
        ptVar14 = ptVar14 + 1;
        ptVar32 = ptVar32 + 1;
      } while (uVar22 != 0);
      if (!_Var11) goto LAB_0010bc1a;
    }
    pptVar23 = &term->post_bidi_cache[oldlen].chars;
  }
  return *pptVar23;
}

Assistant:

static termchar *term_bidi_line(Terminal *term, struct termline *ldata,
                                int scr_y)
{
    termchar *lchars;
    int it;

    /* Do Arabic shaping and bidi. */
    if (!term->no_bidi || !term->no_arabicshaping ||
        (ldata->trusted && term->cols > TRUST_SIGIL_WIDTH)) {

        if (!term_bidi_cache_hit(term, scr_y, ldata->chars, term->cols,
                                 ldata->trusted)) {

            if (term->wcFromTo_size < term->cols) {
                term->wcFromTo_size = term->cols;
                term->wcFrom = sresize(term->wcFrom, term->wcFromTo_size,
                                       bidi_char);
                term->wcTo = sresize(term->wcTo, term->wcFromTo_size,
                                     bidi_char);
            }

            for(it=0; it<term->cols ; it++)
            {
                unsigned long uc = (ldata->chars[it].chr);

                switch (uc & CSET_MASK) {
                  case CSET_LINEDRW:
                    if (!term->rawcnp) {
                        uc = term->ucsdata->unitab_xterm[uc & 0xFF];
                        break;
                    }
                  case CSET_ASCII:
                    uc = term->ucsdata->unitab_line[uc & 0xFF];
                    break;
                  case CSET_SCOACS:
                    uc = term->ucsdata->unitab_scoacs[uc&0xFF];
                    break;
                }
                switch (uc & CSET_MASK) {
                  case CSET_ACP:
                    uc = term->ucsdata->unitab_font[uc & 0xFF];
                    break;
                  case CSET_OEMCP:
                    uc = term->ucsdata->unitab_oemcp[uc & 0xFF];
                    break;
                }

                term->wcFrom[it].origwc = term->wcFrom[it].wc =
                    (unsigned int)uc;
                term->wcFrom[it].index = it;
                term->wcFrom[it].nchars = 1;
            }

            if (ldata->trusted && term->cols > TRUST_SIGIL_WIDTH) {
                memmove(
                    term->wcFrom + TRUST_SIGIL_WIDTH, term->wcFrom,
                    (term->cols - TRUST_SIGIL_WIDTH) * sizeof(*term->wcFrom));
                for (it = 0; it < TRUST_SIGIL_WIDTH; it++) {
                    term->wcFrom[it].origwc = term->wcFrom[it].wc =
                        (it == 0 ? TRUST_SIGIL_CHAR :
                         it == 1 ? UCSWIDE : ' ');
                    term->wcFrom[it].index = BIDI_CHAR_INDEX_NONE;
                    term->wcFrom[it].nchars = 1;
                }
            }

            int nbc = 0;
            for (it = 0; it < term->cols; it++) {
                term->wcFrom[nbc] = term->wcFrom[it];
                if (it+1 < term->cols && term->wcFrom[it+1].wc == UCSWIDE) {
                    term->wcFrom[nbc].nchars++;
                    it++;
                }
                nbc++;
            }

            if(!term->no_bidi)
                do_bidi(term->bidi_ctx, term->wcFrom, nbc);

            if(!term->no_arabicshaping) {
                do_shape(term->wcFrom, term->wcTo, nbc);
            } else {
                /* If we're not calling do_shape, we must copy the
                 * data into wcTo anyway, unchanged */
                memcpy(term->wcTo, term->wcFrom, nbc * sizeof(*term->wcTo));
            }

            if (term->ltemp_size < ldata->size) {
                term->ltemp_size = ldata->size;
                term->ltemp = sresize(term->ltemp, term->ltemp_size,
                                      termchar);
            }

            memcpy(term->ltemp, ldata->chars, ldata->size * TSIZE);

            int opos = 0;
            for (it=0; it<nbc; it++) {
                int ipos = term->wcTo[it].index;
                for (int j = 0; j < term->wcTo[it].nchars; j++) {
                    if (ipos != BIDI_CHAR_INDEX_NONE) {
                        term->ltemp[opos] = ldata->chars[ipos];
                        if (term->ltemp[opos].cc_next)
                            term->ltemp[opos].cc_next -= opos - ipos;

                        if (j > 0)
                            term->ltemp[opos].chr = UCSWIDE;
                        else if (term->wcTo[it].origwc != term->wcTo[it].wc)
                            term->ltemp[opos].chr = term->wcTo[it].wc;
                    } else {
                        term->ltemp[opos] = term->basic_erase_char;
                        term->ltemp[opos].chr =
                            j > 0 ? UCSWIDE : term->wcTo[it].origwc;
                    }
                    opos++;
                }
            }
            assert(opos == term->cols);
            term_bidi_cache_store(term, scr_y, ldata->chars,
                                  term->ltemp, term->wcTo,
                                  term->cols, ldata->size, ldata->trusted);

            lchars = term->ltemp;
        } else {
            lchars = term->post_bidi_cache[scr_y].chars;
        }
    } else {
        lchars = NULL;
    }

    return lchars;
}